

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O2

long duckdb::ListCosineSimilarityFun::GetFunctions(void)

{
  BaseScalarFunction *pBVar1;
  NotImplementedException *this;
  ScalarFunction *func;
  BaseScalarFunction *function;
  long in_RDI;
  pointer pLVar2;
  long lVar3;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_309;
  long local_308;
  code *local_300 [2];
  code *local_2f0;
  code *local_2e8;
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *local_2e0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2d8;
  undefined1 local_2c0 [48];
  LogicalType *local_290;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_288;
  string local_270 [32];
  LogicalType local_250 [24];
  LogicalType local_238 [24];
  LogicalType list;
  ScalarFunction local_208;
  BaseScalarFunction local_e0 [176];
  
  std::__cxx11::string::string(local_270,"list_cosine_similarity",(allocator *)&local_208);
  local_308 = in_RDI;
  duckdb::ScalarFunctionSet::ScalarFunctionSet();
  std::__cxx11::string::~string(local_270);
  duckdb::LogicalType::Real();
  local_290 = local_288.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_2e0 = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
              (local_308 + 0x20);
  pLVar2 = local_288.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    if (pLVar2 == local_290) {
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_288);
      pBVar1 = *(BaseScalarFunction **)(local_308 + 0x28);
      for (function = *(BaseScalarFunction **)(local_308 + 0x20); function != pBVar1;
          function = function + 0x128) {
        BaseScalarFunction::SetReturnsError(local_e0,function);
        duckdb::BaseScalarFunction::~BaseScalarFunction(local_e0);
      }
      return local_308;
    }
    duckdb::LogicalType::LIST(&list);
    if (*pLVar2 == (LogicalType)0x17) {
      duckdb::LogicalType::LogicalType((LogicalType *)local_2c0,&list);
      duckdb::LogicalType::LogicalType((LogicalType *)(local_2c0 + 0x18),&list);
      __l_00._M_len = 2;
      __l_00._M_array = (LogicalType *)local_2c0;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_2d8,__l_00,&local_309);
      duckdb::LogicalType::LogicalType(local_238,pLVar2);
      local_300[1] = (code *)0x0;
      local_300[0] = ListGenericFold<double,duckdb::CosineSimilarityOp>;
      local_2e8 = std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_invoke;
      local_2f0 = std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_manager;
      duckdb::LogicalType::LogicalType(local_250,INVALID);
      duckdb::ScalarFunction::ScalarFunction
                (&local_208,&local_2d8,local_238,local_300,0,0,0,0,local_250,0,0,0);
      std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>(local_2e0,&local_208);
      ScalarFunction::~ScalarFunction(&local_208);
      duckdb::LogicalType::~LogicalType(local_250);
      std::_Function_base::~_Function_base((_Function_base *)local_300);
      duckdb::LogicalType::~LogicalType(local_238);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2d8);
      lVar3 = 0x18;
      do {
        duckdb::LogicalType::~LogicalType((LogicalType *)(local_2c0 + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
    }
    else {
      if (*pLVar2 != (LogicalType)0x16) {
        this = (NotImplementedException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_208,"List function not implemented for type %s",
                   (allocator *)local_300);
        duckdb::LogicalType::ToString_abi_cxx11_();
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this,(string *)&local_208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0);
        __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
      }
      duckdb::LogicalType::LogicalType((LogicalType *)local_2c0,&list);
      duckdb::LogicalType::LogicalType((LogicalType *)(local_2c0 + 0x18),&list);
      __l._M_len = 2;
      __l._M_array = (LogicalType *)local_2c0;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_2d8,__l,&local_309);
      duckdb::LogicalType::LogicalType(local_238,pLVar2);
      local_300[1] = (code *)0x0;
      local_300[0] = ListGenericFold<float,duckdb::CosineSimilarityOp>;
      local_2e8 = std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_invoke;
      local_2f0 = std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_manager;
      duckdb::LogicalType::LogicalType(local_250,INVALID);
      duckdb::ScalarFunction::ScalarFunction
                (&local_208,&local_2d8,local_238,local_300,0,0,0,0,local_250,0,0,0);
      std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>(local_2e0,&local_208);
      ScalarFunction::~ScalarFunction(&local_208);
      duckdb::LogicalType::~LogicalType(local_250);
      std::_Function_base::~_Function_base((_Function_base *)local_300);
      duckdb::LogicalType::~LogicalType(local_238);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2d8);
      lVar3 = 0x18;
      do {
        duckdb::LogicalType::~LogicalType((LogicalType *)(local_2c0 + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
    }
    duckdb::LogicalType::~LogicalType(&list);
    pLVar2 = pLVar2 + 0x18;
  } while( true );
}

Assistant:

ScalarFunctionSet ListCosineSimilarityFun::GetFunctions() {
	ScalarFunctionSet set("list_cosine_similarity");
	for (auto &type : LogicalType::Real()) {
		AddListFoldFunction<CosineSimilarityOp>(set, type);
	}
	for (auto &func : set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return set;
}